

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int initialize(argon2_instance_t *instance,argon2_context *context)

{
  int iVar1;
  uint8_t blockhash [72];
  
  if (context == (argon2_context *)0x0 || instance == (argon2_instance_t *)0x0) {
    return -0x19;
  }
  instance->context_ptr = context;
  iVar1 = allocate_memory(context,instance);
  if (iVar1 == 0) {
    initial_hash(blockhash,context,instance->type);
    clear_internal_memory(blockhash + 0x40,8);
    if (instance->print_internals != 0) {
      initial_kat(blockhash,context,instance->type);
    }
    fill_first_blocks(blockhash,instance);
    clear_internal_memory(blockhash,0x48);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int initialize(argon2_instance_t *instance, argon2_context *context) {
    uint8_t blockhash[ARGON2_PREHASH_SEED_LENGTH];
    int result = ARGON2_OK;

    if (instance == NULL || context == NULL)
        return ARGON2_INCORRECT_PARAMETER;
    instance->context_ptr = context;

    /* 1. Memory allocation */

    result = allocate_memory(context, instance);
    if (result != ARGON2_OK) {
        return result;
    }

    /* 2. Initial hashing */
    /* H_0 + 8 extra bytes to produce the first blocks */
    /* uint8_t blockhash[ARGON2_PREHASH_SEED_LENGTH]; */
    /* Hashing all inputs */
    initial_hash(blockhash, context, instance->type);
    /* Zeroing 8 extra bytes */
    clear_internal_memory(blockhash + ARGON2_PREHASH_DIGEST_LENGTH,
                          ARGON2_PREHASH_SEED_LENGTH -
                              ARGON2_PREHASH_DIGEST_LENGTH);

    if (instance->print_internals) {
        initial_kat(blockhash, context, instance->type);
    }

    /* 3. Creating first blocks, we always have at least two blocks in a slice
     */
    fill_first_blocks(blockhash, instance);
    /* Clearing the hash */
    clear_internal_memory(blockhash, ARGON2_PREHASH_SEED_LENGTH);

    return ARGON2_OK;
}